

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>_>
* __thiscall
phmap::priv::
base_checker<phmap::btree_set<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
::equal_range(pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>_>
              *__return_storage_ptr__,
             base_checker<phmap::btree_set<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
             *this,key_type *key)

{
  undefined8 uVar1;
  undefined4 uVar2;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_std::_Rb_tree_iterator<std::pair<int,_int>_>_>
  pVar3;
  iterator iVar4;
  iterator iVar5;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  tree_iter;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  tree_iter_00;
  
  pVar3 = std::
          _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          ::equal_range(&(this->checker_)._M_t,key);
  iVar4 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          ::lower_bound<std::pair<int,int>>
                    ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                      *)this,key);
  iVar5 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          ::upper_bound<std::pair<int,int>>
                    ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                      *)this,key);
  (__return_storage_ptr__->first).node = iVar4.node;
  (__return_storage_ptr__->first).position = iVar4.position;
  (__return_storage_ptr__->second).node = iVar5.node;
  (__return_storage_ptr__->second).position = iVar5.position;
  tree_iter._12_4_ = 0;
  tree_iter.node =
       (btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
        *)SUB128(iVar4._0_12_,0);
  tree_iter.position = SUB124(iVar4._0_12_,8);
  base_checker<phmap::btree_set<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>,std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>>
  ::
  iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>,std::pair<int,int>&,std::pair<int,int>*>,std::_Rb_tree_const_iterator<std::pair<int,int>>>
            ((base_checker<phmap::btree_set<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>,std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>>
              *)this,tree_iter,(_Base_ptr)pVar3.first._M_node);
  uVar1 = (__return_storage_ptr__->second).node;
  uVar2 = (__return_storage_ptr__->second).position;
  tree_iter_00.position = uVar2;
  tree_iter_00.node =
       (btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
        *)uVar1;
  tree_iter_00._12_4_ = 0;
  base_checker<phmap::btree_set<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>,std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>>
  ::
  iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>,std::pair<int,int>&,std::pair<int,int>*>,std::_Rb_tree_const_iterator<std::pair<int,int>>>
            ((base_checker<phmap::btree_set<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>,std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>>
              *)this,tree_iter_00,(_Base_ptr)pVar3.second._M_node);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_type &key) {
        std::pair<typename CheckerType::iterator, typename CheckerType::iterator>
            checker_res = checker_.equal_range(key);
        std::pair<iterator, iterator> tree_res = tree_.equal_range(key);
        iter_check(tree_res.first, checker_res.first);
        iter_check(tree_res.second, checker_res.second);
        return tree_res;
    }